

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  LibraryDeclarationSyntax *pLVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  Token *in_stack_00000010;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  LibraryIncDirClauseSyntax *in_stack_ffffffffffffff90;
  Info *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  args_4 = TVar3.info;
  deepClone<slang::syntax::FilePathSpecSyntax>(in_stack_000000e0,in_stack_000000d8);
  if ((((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0xa8))->
      super_SyntaxListBase)._vptr_SyntaxListBase != (_func_int **)0x0) {
    deepClone<slang::syntax::LibraryIncDirClauseSyntax>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LibraryDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax>&,slang::syntax::LibraryIncDirClauseSyntax*,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (LibraryIncDirClauseSyntax **)args_4,in_stack_00000010);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LibraryDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LibraryDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.library.deepClone(alloc),
        node.name.deepClone(alloc),
        *deepClone(node.filePaths, alloc),
        node.incDirClause ? deepClone(*node.incDirClause, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}